

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O0

void __thiscall mjs::value_representation::value_representation(value_representation *this,value *v)

{
  bool bVar1;
  value_type vVar2;
  string *this_00;
  gc_heap_ptr<mjs::gc_string> *pgVar3;
  object_ptr *poVar4;
  uint64_t uVar5;
  double d;
  wstring local_1d0 [32];
  wstring_view local_1b0 [2];
  wostringstream local_190 [8];
  wostringstream woss;
  value *v_local;
  value_representation *this_local;
  
  vVar2 = value::type(v);
  switch(vVar2) {
  case undefined:
  case null:
    vVar2 = value::type(v);
    uVar5 = make_repr(vVar2,0);
    this->repr_ = uVar5;
    break;
  case boolean:
    vVar2 = value::type(v);
    bVar1 = value::boolean_value(v);
    uVar5 = make_repr(vVar2,(uint)bVar1);
    this->repr_ = uVar5;
    break;
  case number:
    d = value::number_value(v);
    uVar5 = number_repr(d);
    this->repr_ = uVar5;
    break;
  case string:
    vVar2 = value::type(v);
    this_00 = value::string_value(v);
    pgVar3 = string::unsafe_raw_get(this_00);
    uVar5 = make_repr(vVar2,(pgVar3->super_gc_heap_ptr_untyped).pos_);
    this->repr_ = uVar5;
    break;
  case object:
    vVar2 = value::type(v);
    poVar4 = value::object_value(v);
    uVar5 = make_repr(vVar2,(poVar4->super_gc_heap_ptr_untyped).pos_);
    this->repr_ = uVar5;
    break;
  case reference:
  default:
    std::__cxx11::wostringstream::wostringstream(local_190);
    std::operator<<((wostream *)local_190,"Not handled: ");
    debug_print((wostream *)local_190,v,2,0x7fffffff,0);
    std::__cxx11::wostringstream::str();
    local_1b0[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1d0);
    throw_runtime_error(local_1b0,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                        ,0x38);
  }
  return;
}

Assistant:

value_representation::value_representation(const value& v) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:      repr_ = make_repr(v.type(), 0); return;
    case value_type::boolean:   repr_ = make_repr(v.type(), v.boolean_value()); return;
    case value_type::number:    repr_ = number_repr(v.number_value()); return;
    case value_type::string:    repr_ = make_repr(v.type(), v.string_value().unsafe_raw_get().pos_); return;
    case value_type::object:    repr_ = make_repr(v.type(), v.object_value().pos_); return;
    case value_type::reference: break; // Not legal here
    }
    std::wostringstream woss;
    woss << "Not handled: ";
    debug_print(woss, v, 2);
    THROW_RUNTIME_ERROR(woss.str());
}